

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

void __thiscall expr_tree::divSimplifs(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  bool bVar2;
  expr_node *in_RSI;
  expr_node *tmp;
  expr_node *in_stack_ffffffffffffffd0;
  expr_node *this_00;
  
  bVar2 = IsZero(in_RSI->left);
  if (bVar2) {
    peVar1 = in_RSI->left;
    if (peVar1 != (expr_node *)0x0) {
      expr_node::~expr_node(in_stack_ffffffffffffffd0);
      operator_delete(peVar1,0x28);
    }
    peVar1 = in_RSI->right;
    if (peVar1 != (expr_node *)0x0) {
      expr_node::~expr_node(in_stack_ffffffffffffffd0);
      operator_delete(peVar1,0x28);
    }
    in_RSI->right = (expr_node *)0x0;
    in_RSI->left = (expr_node *)0x0;
    in_RSI->type = '\x01';
    (in_RSI->value).integer = 0;
  }
  else {
    bVar2 = IsOne(in_RSI->right);
    if (bVar2) {
      peVar1 = in_RSI->left;
      this_00 = in_RSI->right;
      if (this_00 != (expr_node *)0x0) {
        expr_node::~expr_node(this_00);
        operator_delete(this_00,0x28);
      }
      in_RSI->type = peVar1->type;
      in_RSI->value = peVar1->value;
      Link(in_RSI,peVar1->left,peVar1->right);
      peVar1->right = (expr_node *)0x0;
      peVar1->left = (expr_node *)0x0;
      if (peVar1 != (expr_node *)0x0) {
        expr_node::~expr_node(this_00);
        operator_delete(peVar1,0x28);
      }
    }
    else {
      bVar2 = IsOne(in_RSI->left);
      if ((((bVar2) && (in_RSI->parent != (expr_node *)0x0)) && (in_RSI->parent->type == '\x05')) &&
         ((in_RSI->parent->value).integer == 3)) {
        bVar2 = IsOnLeft(in_RSI);
        if (bVar2) {
          (in_RSI->parent->value).integer = 4;
          Link(in_RSI->parent,in_RSI->parent->right,in_RSI->right);
          in_RSI->right = (expr_node *)0x0;
          if (in_RSI != (expr_node *)0x0) {
            expr_node::~expr_node(in_stack_ffffffffffffffd0);
            operator_delete(in_RSI,0x28);
          }
        }
        else {
          (in_RSI->parent->value).integer = 4;
          Link(in_RSI->parent,in_RSI->parent->left,in_RSI->right);
          in_RSI->right = (expr_node *)0x0;
          if (in_RSI != (expr_node *)0x0) {
            expr_node::~expr_node(in_stack_ffffffffffffffd0);
            operator_delete(in_RSI,0x28);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void expr_tree::divSimplifs(expr_node* node)
{
    if (IsZero(node->left)) {
        delete node->left;
        delete node->right;
        node->left = node->right = nullptr;
        node->type = INT;
        node->value.integer = 0;
    } else if (IsOne(node->right)) {
        expr_node* tmp = node->left;
        delete node->right;
        node->type = tmp->type;
        node->value = tmp->value;
        Link(node, tmp->left, tmp->right);
        tmp->left = tmp->right = nullptr;
        delete tmp;
    } else if (IsOne(node->left) && node->parent != nullptr && node->parent->type == OP && node->parent->value.integer == MUL) {
        if (IsOnLeft(node)) {
            node->parent->value.integer = DIV;
            Link(node->parent, node->parent->right, node->right);
            node->right = nullptr;
            delete node;
        } else {
            node->parent->value.integer = DIV;
            Link(node->parent, node->parent->left, node->right);
            node->right = nullptr;
            delete node;
        }
    }
}